

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

char * readstring(uint8 *base,uint32 offset,MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  char *strptr;
  uint32 len;
  char *str;
  void *d_local;
  MOJOSHADER_malloc m_local;
  uint32 offset_local;
  uint8 *base_local;
  
  uVar1 = *(uint *)(base + offset);
  if (uVar1 == 0) {
    base_local = (uint8 *)0x0;
  }
  else {
    base_local = (uint8 *)(*m)(uVar1,d);
    memcpy(base_local,(uint *)((long)(base + offset) + 4),(ulong)uVar1);
  }
  return (char *)base_local;
}

Assistant:

static char *readstring(const uint8 *base,
                        const uint32 offset,
                        MOJOSHADER_malloc m,
                        void *d)
{
    // !!! FIXME: sanity checks!
    // !!! FIXME: verify this doesn't go past EOF looking for a null.
    const char *str = ((const char *) base) + offset;
    const uint32 len = *((const uint32 *) str);
    char *strptr = NULL;
    if (len == 0) return NULL; /* No length? No string. */
    strptr = (char *) m(len, d);
    memcpy(strptr, str + 4, len);
    return strptr;
}